

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

void __thiscall
cmConditionEvaluator::cmArgumentList::ReduceTwoArgs
          (cmArgumentList *this,bool value,CurrentAndTwoMoreIter args)

{
  string local_70;
  cmExpandedCommandArgument local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_70,'\x01');
  cmExpandedCommandArgument::cmExpandedCommandArgument(&local_50,&local_70,true);
  std::__cxx11::string::operator=((string *)(args.current._M_node + 1),(string *)&local_50);
  *(bool *)&args.current._M_node[3]._M_next = local_50.Quoted;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.Value._M_dataplus._M_p != &local_50.Value.field_2) {
    operator_delete(local_50.Value._M_dataplus._M_p,local_50.Value.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
  _M_erase(&this->super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>,
           args.nextnext);
  std::__cxx11::list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
  _M_erase(&this->super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>,
           args.next);
  return;
}

Assistant:

void ReduceTwoArgs(const bool value, CurrentAndTwoMoreIter args)
  {
    *args.current = cmExpandedCommandArgument(bool2string(value), true);
    this->erase(args.nextnext);
    this->erase(args.next);
  }